

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_interpolation_qualifiers_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Bitset *flags)

{
  bool bVar1;
  uint uVar2;
  CompilerError *pCVar3;
  allocator local_41;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = (uint)flags->lower;
  if ((uVar2 >> 0xe & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((short)uVar2 < 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x12 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  bVar1 = Bitset::get(flags,0x1497);
  if (bVar1) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  bVar1 = Bitset::get(flags,4999);
  if (bVar1) {
    ::std::__cxx11::string::string
              ((string *)&local_40,"GL_AMD_shader_explicit_vertex_parameter",&local_41);
    require_extension_internal(this,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  bVar1 = Bitset::get(flags,0x14a5);
  if (bVar1) {
    bVar1 = (this->options).es;
    uVar2 = (this->options).version;
    if ((uVar2 < 0x140 & bVar1) == 1) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"pervertexEXT requires ESSL 320.",&local_41);
      CompilerError::CompilerError(pCVar3,&local_40);
      __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (bVar1 == false && uVar2 < 0x1c2) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"pervertexEXT requires GLSL 450.",&local_41);
      CompilerError::CompilerError(pCVar3,&local_40);
      __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (this->barycentric_is_nv == true) {
      ::std::__cxx11::string::string
                ((string *)&local_40,"GL_NV_fragment_shader_barycentric",&local_41);
      require_extension_internal(this,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      ::std::__cxx11::string::string
                ((string *)&local_40,"GL_EXT_fragment_shader_barycentric",&local_41);
      require_extension_internal(this,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_interpolation_qualifiers(const Bitset &flags)
{
	string res;
	//if (flags & (1ull << DecorationSmooth))
	//    res += "smooth ";
	if (flags.get(DecorationFlat))
		res += "flat ";
	if (flags.get(DecorationNoPerspective))
		res += "noperspective ";
	if (flags.get(DecorationCentroid))
		res += "centroid ";
	if (flags.get(DecorationPatch))
		res += "patch ";
	if (flags.get(DecorationSample))
		res += "sample ";
	if (flags.get(DecorationInvariant))
		res += "invariant ";
	if (flags.get(DecorationPerPrimitiveEXT))
	    res += "perprimitiveEXT ";

	if (flags.get(DecorationExplicitInterpAMD))
	{
		require_extension_internal("GL_AMD_shader_explicit_vertex_parameter");
		res += "__explicitInterpAMD ";
	}

	if (flags.get(DecorationPerVertexKHR))
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("pervertexEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("pervertexEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			res += "pervertexNV ";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			res += "pervertexEXT ";
		}
	}

	return res;
}